

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O1

int main(void)

{
  dsList *pdVar1;
  int *data;
  dsListEntry *entry;
  uint *puVar2;
  int iVar3;
  dsCrate *crate;
  dsCrate *local_20;
  
  local_20 = dsOpen("mycrate",1,1);
  iVar3 = 0;
  pdVar1 = dsListAlloc();
  dsSetIndex(pdVar1,0x18);
  do {
    data = (int *)dsAlloc(4);
    *data = iVar3;
    dsListAdd(pdVar1,data);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 10);
  dsSnapshot("mycrate-snapshot");
  dsClose(&local_20);
  local_20 = dsOpen("mycrate-snapshot",0,1);
  pdVar1 = (dsList *)dsGetIndex();
  for (entry = dsListBegin(pdVar1); entry != (dsListEntry *)0x0; entry = dsListNext(entry)) {
    puVar2 = (uint *)dsListData(entry);
    printf("  Item: %d\n",(ulong)*puVar2);
  }
  return 0;
}

Assistant:

int main()
{
	dsCrate *crate = dsOpen("mycrate", 1, 1);

	// Create a new dsList.
	dsList *items = dsListAlloc();

	// Set the list as the crate's index.
	dsSetIndex(items, sizeof(*items));

	// Add items to the list.
	int i;
	for (i = 0; i < 10; i++) {
		struct Item *item = dsAlloc(sizeof(*item));
		item->id = i;

		dsListAdd(items, item);
	}

	// Take a snapshot of the crate.
	dsSnapshot("mycrate-snapshot");

	// Close the crate.
	dsClose(&crate);


	// Open the snapshot.
	crate = dsOpen("mycrate-snapshot", 0, 1);

	// Get the crate's index.
	items = dsGetIndex();

	// Iterate over list.
	dsListEntry *entry;
	for (entry = dsListBegin(items); entry != NULL; entry = dsListNext(entry)) {
		struct Item *item = dsListData(entry);
		printf("  Item: %d\n", item->id);
	}

	return 0;
}